

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall
smf::MidiFile::writeVLValue
          (MidiFile *this,long aValue,vector<unsigned_char,_std::allocator<unsigned_char>_> *outdata
          )

{
  ostream *poVar1;
  byte *__x;
  int i;
  ulong uVar2;
  byte local_1c [4];
  
  if (0xfffffff < (ulong)aValue) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: number too large to convert to VLV");
    std::endl<char,std::char_traits<char>>(poVar1);
    aValue = 0xfffffff;
  }
  local_1c[0] = (byte)((ulong)aValue >> 0x15);
  local_1c[1] = (byte)((ulong)aValue >> 0xe) & 0x7f;
  local_1c[2] = (byte)((ulong)aValue >> 7) & 0x7f;
  local_1c[3] = (byte)aValue & 0x7f;
  for (uVar2 = 0; (uVar2 != 4 && (local_1c[uVar2] == 0)); uVar2 = uVar2 + 1) {
  }
  for (; uVar2 < 3; uVar2 = uVar2 + 1) {
    __x = local_1c + uVar2;
    *__x = *__x | 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(outdata,__x);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(outdata,local_1c + 3);
  return;
}

Assistant:

void MidiFile::writeVLValue(long aValue, std::vector<uchar>& outdata) {
	uchar bytes[4] = {0};

	if ((unsigned long)aValue >= (1 << 28)) {
		std::cerr << "Error: number too large to convert to VLV" << std::endl;
		aValue = 0x0FFFffff;
	}

	bytes[0] = (uchar)(((ulong)aValue >> 21) & 0x7f);  // most significant 7 bits
	bytes[1] = (uchar)(((ulong)aValue >> 14) & 0x7f);
	bytes[2] = (uchar)(((ulong)aValue >> 7)  & 0x7f);
	bytes[3] = (uchar)(((ulong)aValue)       & 0x7f);  // least significant 7 bits

	int start = 0;
	while ((start<4) && (bytes[start] == 0))  start++;

	for (int i=start; i<3; i++) {
		bytes[i] = bytes[i] | 0x80;
		outdata.push_back(bytes[i]);
	}
	outdata.push_back(bytes[3]);
}